

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmArgumentParser.h
# Opt level: O2

cmArgumentParser<(anonymous_namespace)::Result> * __thiscall
cmArgumentParser<(anonymous_namespace)::Result>::Bind
          (cmArgumentParser<(anonymous_namespace)::Result> *this,static_string_view name,
          function<ArgumentParser::Continue_((anonymous_namespace)::Result_&,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
          *f,ExpectAtLeast expect)

{
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  _Any_data local_50;
  long local_40;
  undefined8 uStack_38;
  size_t local_30;
  
  std::
  function<ArgumentParser::Continue_((anonymous_namespace)::Result_&,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
  ::function((function<ArgumentParser::Continue_((anonymous_namespace)::Result_&,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
              *)&local_50,f);
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  local_68 = (code *)0x0;
  pcStack_60 = (code *)0x0;
  local_30 = expect.Count;
  local_78._M_unused._M_object = operator_new(0x28);
  *(undefined8 *)local_78._M_unused._0_8_ = 0;
  *(undefined8 *)((long)local_78._M_unused._0_8_ + 8) = 0;
  *(undefined8 *)((long)local_78._M_unused._0_8_ + 0x10) = 0;
  *(undefined8 *)((long)local_78._M_unused._0_8_ + 0x18) = uStack_38;
  if (local_40 != 0) {
    *(void **)local_78._M_unused._0_8_ = local_50._M_unused._M_object;
    *(undefined8 *)((long)local_78._M_unused._0_8_ + 8) = local_50._8_8_;
    *(long *)((long)local_78._M_unused._0_8_ + 0x10) = local_40;
    local_40 = 0;
    uStack_38 = 0;
  }
  *(size_t *)((long)local_78._M_unused._0_8_ + 0x20) = expect.Count;
  pcStack_60 = std::
               _Function_handler<void_(ArgumentParser::Instance_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmArgumentParser.h:319:28)>
               ::_M_invoke;
  local_68 = std::
             _Function_handler<void_(ArgumentParser::Instance_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmArgumentParser.h:319:28)>
             ::_M_manager;
  ArgumentParser::Base::Bind(&this->super_Base,name.super_string_view,(KeywordAction *)&local_78);
  std::_Function_base::~_Function_base((_Function_base *)&local_78);
  std::_Function_base::~_Function_base((_Function_base *)&local_50);
  return this;
}

Assistant:

cmArgumentParser& Bind(
    cm::static_string_view name,
    std::function<Continue(Result&, cm::string_view, cm::string_view)> f,
    ExpectAtLeast expect = { 1 })
  {
    this->Base::Bind(name, [f, expect](Instance& instance) {
      Result* result = static_cast<Result*>(instance.Result);
      cm::string_view keyword = instance.Keyword;
      instance.Bind(
        [result, keyword, &f](cm::string_view arg) -> Continue {
          return f(*result, keyword, arg);
        },
        expect);
    });
    return *this;
  }